

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

void tb_flush_mips64(CPUState *cpu)

{
  uint *puVar1;
  int iVar2;
  uc_struct_conflict7 *puVar3;
  void **extraout_RDX;
  void **lp;
  void **extraout_RDX_00;
  long lVar4;
  
  puVar3 = cpu->uc;
  memset(cpu->tb_jmp_cache,0,0x8000);
  qht_reset_size((uc_struct_conflict5 *)puVar3,&(puVar3->tcg_ctx->tb_ctx).htable,0x8000);
  puVar3 = cpu->uc;
  iVar2 = puVar3->v_l1_size;
  if (0 < (long)iVar2) {
    lVar4 = 0;
    lp = extraout_RDX;
    do {
      page_flush_tb_1((uc_struct_conflict6 *)(ulong)(uint)puVar3->v_l2_levels,
                      (int)puVar3->l1_map + (int)lVar4,lp);
      lVar4 = lVar4 + 8;
      lp = extraout_RDX_00;
    } while ((long)iVar2 * 8 != lVar4);
  }
  tcg_region_reset_all_mips64((TCGContext_conflict5 *)cpu->uc->tcg_ctx);
  puVar1 = &(cpu->uc->tcg_ctx->tb_ctx).tb_flush_count;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void tb_flush(CPUState *cpu)
{
    unsigned tb_flush_count = cpu->uc->tcg_ctx->tb_ctx.tb_flush_count;
    do_tb_flush(cpu, RUN_ON_CPU_HOST_INT(tb_flush_count));
}